

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int memdbUnfetch(sqlite3_file *pFile,sqlite3_int64 iOfst,void *pPage)

{
  sqlite3_io_methods *psVar1;
  
  psVar1 = pFile[1].pMethods;
  if ((sqlite3_mutex *)psVar1->xTruncate == (sqlite3_mutex *)0x0) {
    *(int *)&psVar1->xSync = *(int *)&psVar1->xSync + -1;
  }
  else {
    (*sqlite3Config.mutex.xMutexEnter)((sqlite3_mutex *)psVar1->xTruncate);
    *(int *)&psVar1->xSync = *(int *)&psVar1->xSync + -1;
    if ((sqlite3_mutex *)psVar1->xTruncate != (sqlite3_mutex *)0x0) {
      (*sqlite3Config.mutex.xMutexLeave)((sqlite3_mutex *)psVar1->xTruncate);
    }
  }
  return 0;
}

Assistant:

static int memdbUnfetch(sqlite3_file *pFile, sqlite3_int64 iOfst, void *pPage){
  MemStore *p = ((MemFile*)pFile)->pStore;
  UNUSED_PARAMETER(iOfst);
  UNUSED_PARAMETER(pPage);
  memdbEnter(p);
  p->nMmap--;
  memdbLeave(p);
  return SQLITE_OK;
}